

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_nanohttp(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  undefined4 uVar21;
  int n_filename;
  uint uVar22;
  undefined *puVar23;
  undefined *puVar24;
  undefined8 uVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  int test_ret;
  undefined8 *puVar29;
  undefined4 *puVar30;
  int test_ret_3;
  undefined **ppuVar31;
  int test_ret_2;
  int test_ret_1;
  ulong local_40;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing nanohttp : 13 of 17 functions ...");
  }
  iVar1 = xmlMemBlocks();
  lVar20 = xmlNanoHTTPOpen("http://localhost/",0);
  xmlNanoHTTPAuthHeader(lVar20);
  call_tests = call_tests + 1;
  if (lVar20 != 0) {
    xmlNanoHTTPClose(lVar20);
  }
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoHTTPAuthHeader",(ulong)(uint)(iVar3 - iVar1));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlNanoHTTPCleanup();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoHTTPCleanup",(ulong)(uint)(iVar5 - iVar3));
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  lVar20 = xmlNanoHTTPOpen("http://localhost/",0);
  xmlNanoHTTPContentLength(lVar20);
  call_tests = call_tests + 1;
  if (lVar20 != 0) {
    xmlNanoHTTPClose(lVar20);
  }
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    iVar7 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoHTTPContentLength",(ulong)(uint)(iVar7 - iVar5));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  lVar20 = xmlNanoHTTPOpen("http://localhost/",0);
  xmlNanoHTTPEncoding(lVar20);
  call_tests = call_tests + 1;
  if (lVar20 != 0) {
    xmlNanoHTTPClose(lVar20);
  }
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar7 != iVar8) {
    iVar9 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoHTTPEncoding",(ulong)(uint)(iVar9 - iVar7));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar26 = 0;
  do {
    ppuVar31 = &PTR_anon_var_dwarf_62f_00162d28;
    uVar22 = 0;
    do {
      iVar10 = xmlMemBlocks();
      if (uVar26 < 5) {
        puVar24 = (&PTR_anon_var_dwarf_62f_00162d28)[uVar26];
      }
      else {
        puVar24 = (undefined *)0x0;
      }
      if (uVar22 < 5) {
        puVar23 = *ppuVar31;
      }
      else {
        puVar23 = (undefined *)0x0;
      }
      xmlNanoHTTPFetch(puVar24,puVar23,0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNanoHTTPFetch",(ulong)(uint)(iVar11 - iVar10));
        iVar9 = iVar9 + 1;
        printf(" %d",(ulong)uVar26);
        printf(" %d");
        printf(" %d");
        putchar(10);
      }
      uVar22 = uVar22 + 1;
      ppuVar31 = ppuVar31 + 1;
    } while (uVar22 != 6);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 6);
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  xmlNanoHTTPInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar10 != iVar11) {
    iVar12 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoHTTPInit",(ulong)(uint)(iVar12 - iVar10));
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar12 = xmlMemBlocks();
  lVar20 = xmlNanoHTTPOpen("http://localhost/",0);
  xmlNanoHTTPMimeType(lVar20);
  call_tests = call_tests + 1;
  if (lVar20 != 0) {
    xmlNanoHTTPClose(lVar20);
  }
  xmlResetLastError();
  iVar13 = xmlMemBlocks();
  if (iVar12 != iVar13) {
    iVar14 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoHTTPMimeType",(ulong)(uint)(iVar14 - iVar12));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar29 = &DAT_00162d88;
  local_34 = 0;
  uVar26 = 0;
  do {
    iVar14 = xmlMemBlocks();
    if (uVar26 < 7) {
      uVar25 = *puVar29;
    }
    else {
      uVar25 = 0;
    }
    xmlNanoHTTPOpen(uVar25,0);
    xmlNanoHTTPClose();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoHTTPOpen",(ulong)(uint)(iVar15 - iVar14));
      local_34 = local_34 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar26 = uVar26 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar26 != 8);
  function_tests = function_tests + 1;
  puVar29 = &DAT_00162d88;
  local_38 = 0;
  uVar26 = 0;
  do {
    iVar14 = xmlMemBlocks();
    if (uVar26 < 7) {
      uVar25 = *puVar29;
    }
    else {
      uVar25 = 0;
    }
    xmlNanoHTTPOpenRedir(uVar25,0,0);
    xmlNanoHTTPClose();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoHTTPOpenRedir",(ulong)(uint)(iVar15 - iVar14));
      local_38 = local_38 + 1;
      printf(" %d");
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar26 = uVar26 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar26 != 8);
  function_tests = function_tests + 1;
  iVar14 = 0;
  local_40 = 0;
  do {
    puVar30 = &DAT_0015fd28;
    uVar26 = 0;
    do {
      iVar15 = xmlMemBlocks();
      lVar20 = xmlNanoHTTPOpen("http://localhost/",0);
      uVar21 = 0xffffffff;
      if (uVar26 < 4) {
        uVar21 = *puVar30;
      }
      xmlNanoHTTPRead(lVar20,0,uVar21);
      call_tests = call_tests + 1;
      if (lVar20 != 0) {
        xmlNanoHTTPClose(lVar20);
      }
      xmlResetLastError();
      iVar16 = xmlMemBlocks();
      if (iVar15 != iVar16) {
        iVar16 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNanoHTTPRead",(ulong)(uint)(iVar16 - iVar15));
        iVar14 = iVar14 + 1;
        printf(" %d",0);
        printf(" %d",local_40);
        printf(" %d");
        putchar(10);
      }
      uVar26 = uVar26 + 1;
      puVar30 = puVar30 + 1;
    } while (uVar26 != 4);
    iVar15 = (int)local_40;
    local_40 = (ulong)(iVar15 + 1);
  } while (iVar15 == 0);
  function_tests = function_tests + 1;
  iVar15 = xmlMemBlocks();
  lVar20 = xmlNanoHTTPOpen("http://localhost/",0);
  xmlNanoHTTPReturnCode(lVar20);
  call_tests = call_tests + 1;
  if (lVar20 != 0) {
    xmlNanoHTTPClose(lVar20);
  }
  xmlResetLastError();
  iVar16 = xmlMemBlocks();
  if (iVar15 != iVar16) {
    iVar17 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoHTTPReturnCode",(ulong)(uint)(iVar17 - iVar15));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar17 = 0;
  uVar28 = 0;
  do {
    ppuVar31 = &PTR_anon_var_dwarf_62f_00162d28;
    uVar26 = 0;
    do {
      iVar18 = xmlMemBlocks();
      if (uVar26 < 5) {
        puVar24 = *ppuVar31;
      }
      else {
        puVar24 = (undefined *)0x0;
      }
      xmlNanoHTTPSave(0,puVar24);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar19 = xmlMemBlocks();
      iVar27 = (int)uVar28;
      if (iVar18 != iVar19) {
        iVar19 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNanoHTTPSave",(ulong)(uint)(iVar19 - iVar18));
        iVar17 = iVar17 + 1;
        printf(" %d",uVar28);
        printf(" %d");
        putchar(10);
      }
      uVar26 = uVar26 + 1;
      ppuVar31 = ppuVar31 + 1;
    } while (uVar26 != 6);
    uVar28 = (ulong)(iVar27 + 1);
  } while (iVar27 == 0);
  function_tests = function_tests + 1;
  uVar26 = 0;
  puVar29 = &DAT_00162d88;
  do {
    if (uVar26 < 7) {
      uVar25 = *puVar29;
    }
    else {
      uVar25 = 0;
    }
    xmlNanoHTTPScanProxy(uVar25);
    call_tests = call_tests + 1;
    xmlResetLastError();
    uVar26 = uVar26 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar26 != 8);
  function_tests = function_tests + 1;
  uVar26 = (uint)(iVar3 != iVar4) + (uint)(iVar1 != iVar2) + (uint)(iVar5 != iVar6) +
           (uint)(iVar7 != iVar8) + iVar9 + (uint)(iVar10 != iVar11) + (uint)(iVar12 != iVar13) +
           local_34 + local_38 + iVar14 + (uint)(iVar15 != iVar16) + iVar17;
  if (uVar26 != 0) {
    printf("Module nanohttp: %d errors\n",(ulong)uVar26);
  }
  return uVar26;
}

Assistant:

static int
test_nanohttp(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing nanohttp : 13 of 17 functions ...\n");
    test_ret += test_xmlNanoHTTPAuthHeader();
    test_ret += test_xmlNanoHTTPCleanup();
    test_ret += test_xmlNanoHTTPContentLength();
    test_ret += test_xmlNanoHTTPEncoding();
    test_ret += test_xmlNanoHTTPFetch();
    test_ret += test_xmlNanoHTTPInit();
    test_ret += test_xmlNanoHTTPMimeType();
    test_ret += test_xmlNanoHTTPOpen();
    test_ret += test_xmlNanoHTTPOpenRedir();
    test_ret += test_xmlNanoHTTPRead();
    test_ret += test_xmlNanoHTTPRedir();
    test_ret += test_xmlNanoHTTPReturnCode();
    test_ret += test_xmlNanoHTTPSave();
    test_ret += test_xmlNanoHTTPScanProxy();

    if (test_ret != 0)
	printf("Module nanohttp: %d errors\n", test_ret);
    return(test_ret);
}